

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.hpp
# Opt level: O0

void __thiscall
helics::PublicationInfo::PublicationInfo
          (PublicationInfo *this,GlobalHandle pid,string_view pkey,string_view ptype,
          string_view punits)

{
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  SmallBuffer *this_01;
  undefined8 in_RSI;
  allocator<char> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_46;
  allocator<char> local_45 [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31;
  
  *(undefined8 *)in_RDI = in_RSI;
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::vector
            ((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              *)0x5c9b7e);
  __t = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x20);
  this_02 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_02,__t,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_02,__t,in_RDI);
  std::allocator<char>::~allocator(local_45);
  this_01 = (SmallBuffer *)(in_RDI + 0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_02,__t,in_RDI);
  std::allocator<char>::~allocator(&local_46);
  SmallBuffer::SmallBuffer(this_01);
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  in_RDI[0xe8] = (allocator<char>)0x0;
  in_RDI[0xe9] = (allocator<char>)0x0;
  in_RDI[0xea] = (allocator<char>)0x0;
  in_RDI[0xeb] = (allocator<char>)0x0;
  *(undefined4 *)(in_RDI + 0xec) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  std::__cxx11::string::string(this_00);
  return;
}

Assistant:

PublicationInfo(GlobalHandle pid,
                    std::string_view pkey,
                    std::string_view ptype,
                    std::string_view punits): id(pid), key(pkey), type(ptype), units(punits)
    {
    }